

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

HashErr lookup_symbol(SymbolTable *s,char *name,SymbolInfo *val,char **original_name_ptr)

{
  char cVar1;
  int iVar2;
  Symbol *pSStack_48;
  char firstc;
  Symbol *sym;
  Bucket *b;
  int bucket_num;
  int i;
  char **original_name_ptr_local;
  SymbolInfo *val_local;
  char *name_local;
  SymbolTable *s_local;
  
  iVar2 = hash_code(name);
  cVar1 = *name;
  b._4_4_ = s->bucket[iVar2]->num_symbols;
  pSStack_48 = s->bucket[iVar2]->symbol;
  while( true ) {
    if (b._4_4_ < 1) {
      return HASH_NOTFOUND;
    }
    if ((cVar1 == *pSStack_48->name) && (iVar2 = strcmp(name,pSStack_48->name), iVar2 == 0)) break;
    pSStack_48 = pSStack_48 + 1;
    b._4_4_ = b._4_4_ + -1;
  }
  if (val != (SymbolInfo *)0x0) {
    *val = pSStack_48->value;
  }
  if (original_name_ptr != (char **)0x0) {
    *original_name_ptr = pSStack_48->name;
  }
  return HASH_NOERR;
}

Assistant:

HashErr
lookup_symbol (const SymbolTable *s, const char *name, SymbolInfo *val,
	       const char **original_name_ptr)
{
  int i, bucket_num = hash_code (name);
  Bucket *b = s->bucket[bucket_num];
  Symbol *sym;
  char firstc = *name;

  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      {
	if (val != NULL)
	  *val = sym->value;
	if (original_name_ptr != NULL)
	  *original_name_ptr = sym->name;
	return HASH_NOERR;
      }

  return HASH_NOTFOUND;
}